

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  LargeMap *pLVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  _Base_ptr p_Var4;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  uint8_t *local_58;
  anon_class_32_4_5f7794cc local_50;
  
  local_50.target = &local_58;
  local_58 = target;
  local_50.extendee = extendee;
  local_50.stream = stream;
  local_50.extension_set = this;
  if ((short)this->flat_size_ < 0) {
    pLVar1 = (this->map_).large;
    for (p_Var4 = (pLVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pLVar1->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      InternalSerializeMessageSetWithCachedSizesToArray::anon_class_32_4_5f7794cc::operator()
                (&local_50,p_Var4[1]._M_color,(Extension *)&p_Var4[1]._M_parent);
    }
  }
  else {
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    local_50.target = &local_58;
    for (; pKVar2 != pKVar3; pKVar2 = pKVar2 + 1) {
      InternalSerializeMessageSetWithCachedSizesToArray::anon_class_32_4_5f7794cc::operator()
                (&local_50,pKVar2->first,&pKVar2->second);
    }
  }
  return local_58;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const ExtensionSet* extension_set = this;
  ForEach([&target, extendee, stream, extension_set](int number,
                                                     const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        extendee, extension_set, number, target, stream);
  });
  return target;
}